

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.h
# Opt level: O3

FieldSymbol * __thiscall
slang::ast::Scope::memberAt<slang::ast::FieldSymbol>(Scope *this,uint32_t index)

{
  FieldSymbol *pFVar1;
  ulong uVar2;
  
  if (this->deferredMemberIndex != Invalid) {
    elaborate(this);
  }
  pFVar1 = (FieldSymbol *)this->firstMember;
  if (index != 0) {
    uVar2 = (ulong)index + 1;
    do {
      pFVar1 = (FieldSymbol *)
               (pFVar1->super_VariableSymbol).super_ValueSymbol.super_Symbol.nextInScope;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  return pFVar1;
}

Assistant:

const T& memberAt(uint32_t index) const {
        return std::ranges::next(members().begin(), index)->as<T>();
    }